

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall QNetworkReplyHttpImplPrivate::completeCacheSave(QNetworkReplyHttpImplPrivate *this)

{
  QAbstractNetworkCache *pQVar1;
  
  if ((this->cacheEnabled == true) && ((this->super_QNetworkReplyPrivate).errorCode != NoError)) {
    pQVar1 = this->managerPrivate->networkCache;
    (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&(this->super_QNetworkReplyPrivate).url);
  }
  else if ((this->cacheEnabled != false) && (this->cacheSaveDevice != (QIODevice *)0x0)) {
    (**(code **)(*(long *)this->managerPrivate->networkCache + 0x90))();
  }
  this->cacheSaveDevice = (QIODevice *)0x0;
  this->cacheEnabled = false;
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::completeCacheSave()
{
    if (cacheEnabled && errorCode != QNetworkReplyImpl::NoError) {
        managerPrivate->networkCache->remove(url);
    } else if (cacheEnabled && cacheSaveDevice) {
        managerPrivate->networkCache->insert(cacheSaveDevice);
    }
    cacheSaveDevice = nullptr;
    cacheEnabled = false;
}